

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O1

bool __thiscall olc::ResourcePack::AddFile(ResourcePack *this,string *sFile)

{
  char cVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  string file;
  string local_60;
  path local_40;
  
  makeposix(&local_60,(ResourcePack *)sFile,sFile);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_40,&local_60,auto_format);
  cVar1 = std::filesystem::status(&local_40);
  std::filesystem::__cxx11::path::~path(&local_40);
  if ((cVar1 != '\0') && (cVar1 != -1)) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&local_40,&local_60,auto_format);
    uVar2 = std::filesystem::file_size(&local_40);
    std::filesystem::__cxx11::path::~path(&local_40);
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_olc::ResourcePack::sResourceFile>_>_>
             ::operator[](&this->mapFiles,&local_60);
    pmVar3->nSize = uVar2;
    pmVar3->nOffset = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return cVar1 != -1 && cVar1 != '\0';
}

Assistant:

bool ResourcePack::AddFile(const std::string& sFile)
	{
		const std::string file = makeposix(sFile);

		if (_gfs::exists(file))
		{
			sResourceFile e;
			e.nSize = (uint32_t)_gfs::file_size(file);
			e.nOffset = 0; // Unknown at this stage			
			mapFiles[file] = e;
			return true;
		}
		return false;
	}